

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  String local_38 [2];
  Message *local_18;
  Message *msg_local;
  Message *this_local;
  
  local_18 = msg;
  msg_local = this;
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->ss_,
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  pbVar1 = internal::
           scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&this->ss_);
  GetString((Message *)local_38);
  internal::operator<<((ostream *)(pbVar1 + 0x10),local_38);
  internal::String::~String(local_38);
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }